

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ConcurrentAssertionMemberSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConcurrentAssertionMemberSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::ConcurrentAssertionStatementSyntax&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          ConcurrentAssertionStatementSyntax *args_1)

{
  ConcurrentAssertionMemberSyntax *this_00;
  
  this_00 = (ConcurrentAssertionMemberSyntax *)
            ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConcurrentAssertionMemberSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (ConcurrentAssertionMemberSyntax *)allocateSlow(this,0x58,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  slang::syntax::ConcurrentAssertionMemberSyntax::ConcurrentAssertionMemberSyntax
            (this_00,args,args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }